

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::normalize_name
          (string *__return_storage_ptr__,t_netstd_generator *this,string *name,bool is_arg_name)

{
  __type _Var1;
  bool bVar2;
  _Self local_88;
  _Self local_80;
  char *local_78;
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  string tmp;
  bool is_arg_name_local;
  string *name_local;
  t_netstd_generator *this_local;
  
  tmp.field_2._M_local_buf[0xf] = is_arg_name;
  std::__cxx11::string::string((string *)local_48,(string *)name);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58._M_current = (char *)std::__cxx11::string::end();
  local_60 = (char *)std::__cxx11::string::begin();
  local_78 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_50,local_58,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_60,tolower);
  if (((tmp.field_2._M_local_buf[0xf] & 1U) != 0) &&
     (_Var1 = std::operator==(&CANCELLATION_TOKEN_NAME_abi_cxx11_,name), _Var1)) {
    std::__cxx11::string::operator+=((string *)name,"_");
  }
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->netstd_keywords,(key_type *)local_48);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->netstd_keywords);
  bVar2 = std::operator!=(&local_80,&local_88);
  if (bVar2) {
    std::operator+(__return_storage_ptr__,"@",name);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::normalize_name(string name, bool is_arg_name)
{
    string tmp(name);
    transform(tmp.begin(), tmp.end(), tmp.begin(), static_cast<int(*)(int)>(tolower));

    // check for reserved argument names
    if( is_arg_name && (CANCELLATION_TOKEN_NAME == name))
	{
		name += "_";
	}

    // un-conflict keywords by prefixing with "@"
    if (netstd_keywords.find(tmp) != netstd_keywords.end())
    {
        return "@" + name;
    }
	
    // no changes necessary
    return name;
}